

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserTransform.cpp
# Opt level: O0

bool __thiscall
Rml::PropertyParserTransform::Scan
          (PropertyParserTransform *this,int *out_bytes_read,char *str,char *keyword,
          PropertyParser **parsers,NumericValue *args,int nargs)

{
  NumericValue NVar1;
  bool bVar2;
  PropertyParser **__s2;
  int iVar3;
  char *__s1;
  size_t sVar4;
  float fVar5;
  byte local_551;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  byte local_4fb;
  byte local_4fa;
  allocator<char> local_4f9;
  string local_4f8 [32];
  undefined1 local_4d8 [8];
  Property prop;
  int i;
  string local_478 [8];
  String arg_heap;
  char arg_stack [1024];
  char *local_50;
  char *arg;
  int bytes_read;
  int total_bytes_read;
  NumericValue *args_local;
  PropertyParser **parsers_local;
  char *keyword_local;
  char *str_local;
  int *out_bytes_read_local;
  PropertyParserTransform *this_local;
  
  *out_bytes_read = 0;
  arg._4_4_ = 0;
  arg._0_4_ = 0;
  _bytes_read = args;
  args_local = (NumericValue *)parsers;
  parsers_local = (PropertyParser **)keyword;
  keyword_local = str;
  str_local = (char *)out_bytes_read;
  out_bytes_read_local = (int *)this;
  __isoc99_sscanf(str," %n",&arg);
  __s2 = parsers_local;
  __s1 = keyword_local + (int)arg;
  arg._4_4_ = (int)arg + arg._4_4_;
  keyword_local = __s1;
  sVar4 = strlen((char *)parsers_local);
  iVar3 = memcmp(__s1,__s2,sVar4);
  if (iVar3 == 0) {
    sVar4 = strlen((char *)parsers_local);
    keyword_local = keyword_local + (int)sVar4;
    arg._4_4_ = (int)sVar4 + arg._4_4_;
    arg._0_4_ = 0;
    __isoc99_sscanf(keyword_local," %n",&arg);
    keyword_local = keyword_local + (int)arg;
    arg._4_4_ = (int)arg + arg._4_4_;
    arg._0_4_ = 0;
    __isoc99_sscanf(keyword_local," ( %n",&arg);
    if ((int)arg == 0) {
      this_local._7_1_ = 0;
    }
    else {
      keyword_local = keyword_local + (int)arg;
      arg._4_4_ = (int)arg + arg._4_4_;
      ::std::__cxx11::string::string(local_478);
      sVar4 = strlen(keyword_local);
      if (sVar4 < 0x400) {
        local_50 = arg_heap.field_2._M_local_buf + 8;
      }
      else {
        ::std::__cxx11::string::operator=(local_478,keyword_local);
        local_50 = (char *)::std::__cxx11::string::operator[]((ulong)local_478);
      }
      for (prop.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._0_4_ = 0;
          (int)prop.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi < nargs;
          prop.source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ =
               (int)prop.source.
                    super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1) {
        Property::Property((Property *)local_4d8);
        arg._0_4_ = 0;
        __isoc99_sscanf(keyword_local," %[^,)] %n",local_50,&arg);
        local_4fa = 0;
        local_4fb = 0;
        local_551 = 0;
        if ((int)arg != 0) {
          NVar1 = args_local
                  [(int)prop.source.
                        super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi];
          ::std::allocator<char>::allocator();
          local_4fa = 1;
          ::std::__cxx11::string::string<std::allocator<char>>(local_4f8,local_50,&local_4f9);
          local_4fb = 1;
          robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::Table(&local_530);
          local_551 = (**(code **)(*(long *)NVar1 + 0x10))(NVar1,local_4d8,local_4f8,&local_530);
          robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~Table(&local_530);
        }
        if ((local_4fb & 1) != 0) {
          ::std::__cxx11::string::~string(local_4f8);
        }
        if ((local_4fa & 1) != 0) {
          ::std::allocator<char>::~allocator(&local_4f9);
        }
        if ((local_551 & 1) == 0) {
          this_local._7_1_ = 0;
          bVar2 = true;
        }
        else {
          fVar5 = Variant::Get<float>((Variant *)local_4d8,0.0);
          _bytes_read
          [(int)prop.source.
                super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi].number = fVar5;
          _bytes_read
          [(int)prop.source.
                super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi].unit = prop.value.data._24_4_;
          keyword_local = keyword_local + (int)arg;
          arg._4_4_ = (int)arg + arg._4_4_;
          if ((int)prop.source.
                   super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi < nargs + -1) {
            arg._0_4_ = 0;
            __isoc99_sscanf(keyword_local," , %n",&arg);
            if ((int)arg == 0) {
              this_local._7_1_ = 0;
              bVar2 = true;
              goto LAB_005f7f0d;
            }
            keyword_local = keyword_local + (int)arg;
            arg._4_4_ = (int)arg + arg._4_4_;
          }
          bVar2 = false;
        }
LAB_005f7f0d:
        Property::~Property((Property *)local_4d8);
        if (bVar2) goto LAB_005f7fbb;
      }
      arg._0_4_ = 0;
      __isoc99_sscanf(keyword_local," ) %n",&arg);
      if ((int)arg == 0) {
        this_local._7_1_ = 0;
      }
      else {
        keyword_local = keyword_local + (int)arg;
        arg._4_4_ = (int)arg + arg._4_4_;
        *(int *)str_local = arg._4_4_;
        this_local._7_1_ = 0 < arg._4_4_;
      }
LAB_005f7fbb:
      ::std::__cxx11::string::~string(local_478);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PropertyParserTransform::Scan(int& out_bytes_read, const char* str, const char* keyword, const PropertyParser** parsers, NumericValue* args,
	int nargs) const
{
	out_bytes_read = 0;
	int total_bytes_read = 0, bytes_read = 0;

	/* skip leading white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the keyword */
	if (!memcmp(str, keyword, strlen(keyword)))
	{
		bytes_read = (int)strlen(keyword);
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* skip any white space */
	bytes_read = 0;
	sscanf(str, " %n", &bytes_read);
	str += bytes_read;
	total_bytes_read += bytes_read;

	/* find the opening brace */
	bytes_read = 0;
	if (sscanf(str, " ( %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	/* use the quicker stack-based argument buffer, if possible */
	char* arg = nullptr;
	char arg_stack[1024];
	String arg_heap;
	if (strlen(str) < sizeof(arg_stack))
	{
		arg = arg_stack;
	}
	else
	{
		arg_heap = str;
		arg = &arg_heap[0];
	}

	/* parse the arguments */
	for (int i = 0; i < nargs; ++i)
	{
		Property prop;

		bytes_read = 0;
		if (sscanf(str, " %[^,)] %n", arg, &bytes_read), bytes_read && parsers[i]->ParseValue(prop, String(arg), ParameterMap()))
		{
			args[i].number = prop.value.Get<float>();
			args[i].unit = prop.unit;
			str += bytes_read;
			total_bytes_read += bytes_read;
		}
		else
		{
			return false;
		}

		/* find the comma */
		if (i < nargs - 1)
		{
			bytes_read = 0;
			if (sscanf(str, " , %n", &bytes_read), bytes_read)
			{
				str += bytes_read;
				total_bytes_read += bytes_read;
			}
			else
			{
				return false;
			}
		}
	}

	/* find the closing brace */
	bytes_read = 0;
	if (sscanf(str, " ) %n", &bytes_read), bytes_read)
	{
		str += bytes_read;
		total_bytes_read += bytes_read;
	}
	else
	{
		return false;
	}

	out_bytes_read = total_bytes_read;
	return total_bytes_read > 0;
}